

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

uint __thiscall
capnp::compiler::NodeTranslator::StructLayout::Union::addNewPointerLocation(Union *this)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint uVar4;
  size_t newSize;
  
  uVar4 = (*this->parent->_vptr_StructOrGroup[2])();
  puVar1 = (this->pointerLocations).builder.endPtr;
  if ((this->pointerLocations).builder.pos == puVar1) {
    puVar2 = (this->pointerLocations).builder.ptr;
    newSize = 4;
    if (puVar1 != puVar2) {
      newSize = (long)puVar1 - (long)puVar2 >> 1;
    }
    kj::Vector<unsigned_int>::setCapacity(&this->pointerLocations,newSize);
  }
  puVar3 = (this->pointerLocations).builder.pos;
  *puVar3 = uVar4;
  (this->pointerLocations).builder.pos = puVar3 + 1;
  return uVar4;
}

Assistant:

uint addNewPointerLocation() {
      // Add a whole new pointer location to the union with the given size.

      return pointerLocations.add(parent.addPointer());
    }